

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcBuildingElementProxy::IfcBuildingElementProxy
          (IfcBuildingElementProxy *this)

{
  IfcBuildingElementProxy *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x180,"IfcBuildingElementProxy");
  IfcBuildingElement::IfcBuildingElement
            ((IfcBuildingElement *)this,&PTR_construction_vtable_24__00e29ad0);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcBuildingElementProxy,_1UL>::ObjectHelper
            (&this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcBuildingElementProxy,_1UL>,
             &PTR_construction_vtable_24__00e29c08);
  *(undefined8 *)this = 0xe299a0;
  *(undefined8 *)&this->field_0x180 = 0xe29ab8;
  *(undefined8 *)&this->field_0x88 = 0xe299c8;
  *(undefined8 *)&this->field_0x98 = 0xe299f0;
  *(undefined8 *)&this->field_0xd0 = 0xe29a18;
  *(undefined8 *)&this->field_0x100 = 0xe29a40;
  *(undefined8 *)&this->field_0x138 = 0xe29a68;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcBuildingElementProxy,_1UL>).
  _vptr_ObjectHelper = (_func_int **)0xe29a90;
  STEP::Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Maybe((Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcBuildingElementProxy,_1UL>).
         field_0x10);
  return;
}

Assistant:

IfcBuildingElementProxy() : Object("IfcBuildingElementProxy") {}